

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscep.c
# Opt level: O0

EVP_MD * get_digest_alg(char *arg,int ca_caps)

{
  int iVar1;
  int ca_caps_local;
  char *arg_local;
  
  if (arg == (char *)0x0) {
    if ((ca_caps & 0x200U) == 0) {
      if ((ca_caps & 0x100U) == 0) {
        if (((ca_caps & 0x80U) == 0) && ((ca_caps & 0x400U) == 0)) {
          if ((ca_caps & 0x40U) == 0) {
            if ((ca_caps & 0x20U) == 0) {
              arg_local = (char *)EVP_md5();
            }
            else {
              arg_local = (char *)EVP_sha1();
            }
          }
          else {
            arg_local = (char *)EVP_sha224();
          }
        }
        else {
          arg_local = (char *)EVP_sha256();
        }
      }
      else {
        arg_local = (char *)EVP_sha384();
      }
    }
    else {
      arg_local = (char *)EVP_sha512();
    }
  }
  else {
    iVar1 = strncmp(arg,"md5",3);
    if (iVar1 == 0) {
      arg_local = (char *)EVP_md5();
    }
    else {
      iVar1 = strncmp(arg,"sha1",4);
      if (iVar1 == 0) {
        arg_local = (char *)EVP_sha1();
      }
      else {
        iVar1 = strncmp(arg,"sha224",6);
        if (iVar1 == 0) {
          arg_local = (char *)EVP_sha224();
        }
        else {
          iVar1 = strncmp(arg,"sha256",6);
          if (iVar1 == 0) {
            arg_local = (char *)EVP_sha256();
          }
          else {
            iVar1 = strncmp(arg,"sha384",6);
            if (iVar1 == 0) {
              arg_local = (char *)EVP_sha384();
            }
            else {
              iVar1 = strncmp(arg,"sha512",6);
              if (iVar1 == 0) {
                arg_local = (char *)EVP_sha512();
              }
              else {
                arg_local = (char *)0x0;
              }
            }
          }
        }
      }
    }
  }
  return (EVP_MD *)arg_local;
}

Assistant:

const EVP_MD *get_digest_alg(const char *arg, int ca_caps)
{
	if (!arg) {
		if (SUP_CAP_SHA_512(ca_caps))
			return EVP_sha512();
		else if (SUP_CAP_SHA_384(ca_caps))
			return EVP_sha384();
		else if (SUP_CAP_SHA_256(ca_caps))
			return EVP_sha256();
		else if (SUP_CAP_SHA_224(ca_caps))
			return EVP_sha224();
		else if (SUP_CAP_SHA_1(ca_caps))
			return EVP_sha1();
		else
			return EVP_md5();
	} else if (!strncmp(arg, "md5", 3)) {
		return EVP_md5();
	} else if (!strncmp(arg, "sha1", 4)) {
		return EVP_sha1();
	} else if (!strncmp(arg, "sha224", 6)) {
		return EVP_sha224();
	} else if (!strncmp(arg, "sha256", 6)) {
		return EVP_sha256();
	} else if (!strncmp(arg, "sha384", 6)) {
		return EVP_sha384();
	} else if (!strncmp(arg, "sha512", 6)) {
		return EVP_sha512();
	} else {
		return NULL;
	}
}